

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_outlines_fuzzer.cc
# Opt level: O0

int LLVMFuzzerTestOneInput(uchar *data,size_t size)

{
  undefined1 local_50 [8];
  FuzzHelper f;
  size_t size_local;
  uchar *data_local;
  
  f.discard.super_Pipeline.next_ = (Pipeline *)size;
  setenv("JSIMD_FORCENONE","1",1);
  FuzzHelper::FuzzHelper((FuzzHelper *)local_50,data,(size_t)f.discard.super_Pipeline.next_);
  FuzzHelper::run((FuzzHelper *)local_50);
  FuzzHelper::~FuzzHelper((FuzzHelper *)local_50);
  return 0;
}

Assistant:

int
LLVMFuzzerTestOneInput(unsigned char const* data, size_t size)
{
#ifndef _WIN32
    // Used by jpeg library to work around false positives in memory
    // sanitizer.
    setenv("JSIMD_FORCENONE", "1", 1);
#endif
    FuzzHelper f(data, size);
    f.run();
    return 0;
}